

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix3x3.cpp
# Opt level: O1

void __thiscall CMU462::Matrix3x3::operator/=(Matrix3x3 *this,double x)

{
  int i;
  long lVar1;
  long lVar2;
  Matrix3x3 *A;
  
  lVar1 = 0;
  do {
    lVar2 = 0;
    do {
      *(double *)((long)this + lVar2) = *(double *)((long)this + lVar2) * (1.0 / x);
      lVar2 = lVar2 + 0x18;
    } while (lVar2 != 0x48);
    lVar1 = lVar1 + 1;
    this = (Matrix3x3 *)((long)this + 8);
  } while (lVar1 != 3);
  return;
}

Assistant:

void Matrix3x3::operator/=( double x ) {
    Matrix3x3& A( *this );
    double rx = 1./x;

    for( int i = 0; i < 3; i++ )
    for( int j = 0; j < 3; j++ )
    {
       A( i, j ) *= rx;
    }
  }